

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

mg_connection *
mg_download(char *host,int port,int use_ssl,char *ebuf,size_t ebuf_len,char *fmt,...)

{
  char in_AL;
  int iVar1;
  mg_connection *conn;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int reqerr;
  va_list ap;
  int local_fc;
  __va_list_tag local_f8;
  undefined1 local_d8 [48];
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &stack0x00000008;
  local_f8.gp_offset = 0x30;
  local_f8.fp_offset = 0x30;
  conn = mg_connect_client(host,port,use_ssl,ebuf,ebuf_len);
  if (conn != (mg_connection *)0x0) {
    iVar1 = mg_vprintf(conn,fmt,&local_f8);
    if (iVar1 < 1) {
      mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Error sending request");
    }
    else {
      conn->data_len = 0;
      get_response(conn,ebuf,ebuf_len,&local_fc);
      (conn->request_info).local_uri = (conn->request_info).request_uri;
    }
  }
  if ((conn != (mg_connection *)0x0) && (*ebuf != '\0')) {
    mg_close_connection(conn);
    conn = (mg_connection *)0x0;
  }
  return conn;
}

Assistant:

mg_connection *
mg_download(const char *host,
            int port,
            int use_ssl,
            char *ebuf,
            size_t ebuf_len,
            const char *fmt,
            ...)
{
	struct mg_connection *conn;
	va_list ap;
	int i;
	int reqerr;

	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}

	va_start(ap, fmt);

	/* open a connection */
	conn = mg_connect_client(host, port, use_ssl, ebuf, ebuf_len);

	if (conn != NULL) {
		i = mg_vprintf(conn, fmt, ap);
		if (i <= 0) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Error sending request");
		} else {
			/* make sure the buffer is clear */
			conn->data_len = 0;
			get_response(conn, ebuf, ebuf_len, &reqerr);

			/* TODO: here, the URI is the http response code */
			conn->request_info.local_uri = conn->request_info.request_uri;
		}
	}

	/* if an error occurred, close the connection */
	if ((ebuf[0] != '\0') && (conn != NULL)) {
		mg_close_connection(conn);
		conn = NULL;
	}

	va_end(ap);
	return conn;
}